

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  Vec_Int_t *pVVar1;
  Vec_Wrd_t *p_00;
  int iVar2;
  int iVar3;
  Hsh_IntObj_t *pHVar4;
  uint *puVar5;
  int *piVar6;
  word Entry;
  word *pwVar7;
  int *pPlace;
  int i;
  int iData_local;
  Hsh_IntMan_t *p_local;
  
  iVar2 = Vec_WrdSize(p->vObjs);
  iVar3 = Vec_IntSize(p->vTable);
  if (iVar3 < iVar2) {
    pVVar1 = p->vTable;
    iVar2 = Vec_IntSize(p->vTable);
    iVar2 = Abc_PrimeCudd(iVar2 << 1);
    Vec_IntFill(pVVar1,iVar2,-1);
    for (pPlace._0_4_ = 0; iVar2 = Vec_WrdSize(p->vObjs), (int)pPlace < iVar2;
        pPlace._0_4_ = (int)pPlace + 1) {
      pVVar1 = p->vTable;
      pHVar4 = Hsh_IntObj(p,(int)pPlace);
      puVar5 = Hsh_IntData(p,pHVar4->iData);
      iVar2 = p->nSize;
      iVar3 = Vec_IntSize(p->vTable);
      iVar2 = Hsh_IntManHash(puVar5,iVar2,iVar3);
      piVar6 = Vec_IntEntryP(pVVar1,iVar2);
      iVar2 = *piVar6;
      pHVar4 = Hsh_IntObj(p,(int)pPlace);
      pHVar4->iNext = iVar2;
      *piVar6 = (int)pPlace;
    }
  }
  puVar5 = Hsh_IntData(p,iData);
  piVar6 = Hsh_IntManLookup(p,puVar5);
  if (*piVar6 == -1) {
    iVar2 = Vec_WrdSize(p->vObjs);
    *piVar6 = iVar2;
    p_00 = p->vObjs;
    Entry = Hsh_IntWord(iData,-1);
    Vec_WrdPush(p_00,Entry);
    iVar2 = Vec_WrdSize(p->vObjs);
    p_local._4_4_ = iVar2 + -1;
  }
  else {
    pHVar4 = Hsh_IntObj(p,*piVar6);
    pwVar7 = Vec_WrdArray(p->vObjs);
    p_local._4_4_ = (int)((long)pHVar4 - (long)pwVar7 >> 3);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, Hsh_IntObj(p, i)->iData), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}